

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O2

int Gia_ManGraphToAig(Gia_Man_t *p,Dec_Graph_t *pGraph)

{
  Dec_Edge_t DVar1;
  Dec_Node_t *pDVar2;
  int iLit1;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 *local_40;
  
  DVar1 = pGraph->eRoot;
  if (pGraph->fConst != 0) {
    return ~(uint)DVar1 & 1;
  }
  uVar4 = (uint)DVar1 >> 1 & 0x3fffffff;
  uVar6 = (ulong)(uint)pGraph->nLeaves;
  if (uVar4 < (uint)pGraph->nLeaves) {
    iVar3 = pGraph->pNodes[uVar4].field_2.iFunc;
  }
  else {
    lVar5 = uVar6 * 0x18;
    local_40 = (undefined1 *)0x0;
    for (; (long)uVar6 < (long)pGraph->nSize; uVar6 = uVar6 + 1) {
      pDVar2 = pGraph->pNodes;
      local_40 = &(pDVar2->eEdge0).field_0x0 + lVar5;
      uVar4 = *(uint *)(&(pDVar2->eEdge0).field_0x0 + lVar5);
      iVar3 = Abc_LitNotCond(pDVar2[uVar4 >> 1 & 0x3fffffff].field_2.iFunc,uVar4 & 1);
      uVar4 = *(uint *)(&(pDVar2->eEdge1).field_0x0 + lVar5);
      iLit1 = Abc_LitNotCond(pGraph->pNodes[uVar4 >> 1 & 0x3fffffff].field_2.iFunc,uVar4 & 1);
      iVar3 = Gia_ManHashAnd(p,iVar3,iLit1);
      *(int *)((long)&pDVar2->field_2 + lVar5) = iVar3;
      lVar5 = lVar5 + 0x18;
    }
    iVar3 = *(int *)(local_40 + 8);
    DVar1 = pGraph->eRoot;
  }
  iVar3 = Abc_LitNotCond(iVar3,(uint)DVar1 & 1);
  return iVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create GIA for SOP.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManGraphToAig( Gia_Man_t * p, Dec_Graph_t * pGraph )
{
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i, iAnd0, iAnd1;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Dec_GraphVar(pGraph)->iFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        iAnd0 = Abc_LitNotCond( Dec_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        iAnd1 = Abc_LitNotCond( Dec_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        pNode->iFunc = Gia_ManHashAnd( p, iAnd0, iAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Dec_GraphIsComplement(pGraph) );
}